

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t do_mvcl(CPUS390XState_conflict *env,uint64_t *dest,uint64_t *destlen,uint64_t *src,
                uint64_t *srclen,uint16_t pad,int wordsize,uintptr_t ra)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  int iVar6;
  int size;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  S390Access local_80;
  S390Access local_58;
  
  uVar1 = (env->psw).mask;
  iVar6 = 3;
  if ((uVar1 >> 0x3a & 1) != 0) {
    switch((uint)(uVar1 >> 0x2e) & 3) {
    case 0:
      iVar6 = 0;
      break;
    case 1:
      abort();
    case 2:
      iVar6 = 1;
      break;
    case 3:
      iVar6 = 2;
    }
  }
  uVar1 = *destlen;
  uVar2 = *srclen;
  uVar4 = 0;
  if (uVar1 != uVar2) {
    uVar4 = 2 - (uVar1 < uVar2);
  }
  uVar8 = -(*dest | 0xfffffffffffff000);
  if (uVar1 < uVar8) {
    uVar8 = uVar1;
  }
  if (uVar1 != 0) {
    if (uVar2 == 0) {
      size = (int)uVar8;
      if (wordsize == 1) {
        *destlen = uVar1 - uVar8;
        access_prepare(&local_80,env,*dest,size,MMU_DATA_STORE,iVar6,ra);
        access_memset(env,&local_80,(uint8_t)pad,ra);
      }
      else {
        access_prepare(&local_80,env,*dest,size,MMU_DATA_STORE,iVar6,ra);
        iVar6 = 0;
        do {
          uVar3 = pad >> 8;
          if ((*destlen & 1) != 0) {
            uVar3 = pad;
          }
          access_set_byte(env,&local_80,iVar6,(uint8_t)uVar3,ra);
          *destlen = *destlen - 1;
          iVar6 = iVar6 + 1;
        } while (size != iVar6);
      }
      uVar9 = uVar8 + *dest;
      uVar1 = (env->psw).mask;
      if ((uVar1 & 0x100000000) == 0) {
        if ((int)uVar1 < 0) {
          uVar7 = (uint)uVar9 & 0x7fffffff;
        }
        else {
          uVar7 = (uint)uVar9 & 0xffffff;
        }
        uVar9 = (ulong)uVar7;
      }
    }
    else {
      uVar9 = -(*src | 0xfffffffffffff000);
      if (uVar2 < -(*src | 0xfffffffffffff000)) {
        uVar9 = uVar2;
      }
      if (uVar8 <= uVar9) {
        uVar9 = uVar8;
      }
      *destlen = uVar1 - uVar9;
      *srclen = *srclen - uVar9;
      access_prepare(&local_58,env,*src,(int)uVar9,MMU_DATA_LOAD,iVar6,ra);
      access_prepare(&local_80,env,*dest,(int)uVar9,MMU_DATA_STORE,iVar6,ra);
      access_memmove(env,&local_80,&local_58,ra);
      uVar5 = *src + uVar9;
      uVar1 = (env->psw).mask;
      if ((uVar1 & 0x100000000) == 0) {
        if ((int)uVar1 < 0) {
          uVar5 = (uint64_t)((uint)uVar5 & 0x7fffffff);
        }
        else {
          uVar5 = (uint64_t)((uint)uVar5 & 0xffffff);
        }
      }
      *src = uVar5;
      uVar9 = uVar9 + *dest;
      uVar1 = (env->psw).mask;
      if ((uVar1 & 0x100000000) == 0) {
        if ((int)uVar1 < 0) {
          uVar9 = (ulong)((uint)uVar9 & 0x7fffffff);
        }
        else {
          uVar9 = (ulong)((uint)uVar9 & 0xffffff);
        }
      }
    }
    *dest = uVar9;
    if (*destlen != 0) {
      uVar4 = 3;
    }
  }
  return uVar4;
}

Assistant:

static inline uint32_t do_mvcl(CPUS390XState *env,
                               uint64_t *dest, uint64_t *destlen,
                               uint64_t *src, uint64_t *srclen,
                               uint16_t pad, int wordsize, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    int len = MIN(*destlen, -(*dest | TARGET_PAGE_MASK));
    S390Access srca, desta;
    int i, cc;

    if (*destlen == *srclen) {
        cc = 0;
    } else if (*destlen < *srclen) {
        cc = 1;
    } else {
        cc = 2;
    }

    if (!*destlen) {
        return cc;
    }

    /*
     * Only perform one type of type of operation (move/pad) at a time.
     * Stay within single pages.
     */
    if (*srclen) {
        /* Copy the src array */
        len = MIN(MIN(*srclen, -(*src | TARGET_PAGE_MASK)), len);
        *destlen -= len;
        *srclen -= len;
        srca = access_prepare(env, *src, len, MMU_DATA_LOAD, mmu_idx, ra);
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);
        access_memmove(env, &desta, &srca, ra);
        *src = wrap_address(env, *src + len);
        *dest = wrap_address(env, *dest + len);
    } else if (wordsize == 1) {
        /* Pad the remaining area */
        *destlen -= len;
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);
        access_memset(env, &desta, pad, ra);
        *dest = wrap_address(env, *dest + len);
    } else {
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);

        /* The remaining length selects the padding byte. */
        for (i = 0; i < len; (*destlen)--, i++) {
            if (*destlen & 1) {
                access_set_byte(env, &desta, i, pad, ra);
            } else {
                access_set_byte(env, &desta, i, pad >> 8, ra);
            }
        }
        *dest = wrap_address(env, *dest + len);
    }

    return *destlen ? 3 : cc;
}